

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O1

void __thiscall Writer::unionDefinition(Writer *this,Program *param_1,UnionType *strct)

{
  pointer ppVar1;
  pointer ppVar2;
  string local_70;
  string local_50;
  
  CWriter::startUnion(&this->wr,&(strct->super_AggregateType).name);
  ppVar2 = (strct->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (strct->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    do {
      CWriter::indent(&this->wr,1);
      (*ppVar2->first->_vptr_Type[3])(&local_70);
      (*ppVar2->first->_vptr_Type[4])(&local_50,ppVar2->first,&ppVar2->second);
      CWriter::structItem(&this->wr,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
  }
  CWriter::endStruct(&this->wr);
  return;
}

Assistant:

void Writer::unionDefinition(const Program& /*program*/, const UnionType* strct) {
    wr.startUnion(strct->name);

    for (const auto& pair : strct->items) {
        const auto& ty = pair.first;
        const auto& name = pair.second;
        wr.indent(1);
        wr.structItem(ty->toString(), ty->surroundName(name));
    }

    wr.endStruct();
}